

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::WildcardPattern::~WildcardPattern(WildcardPattern *this)

{
  WildcardPattern *this_local;
  
  ~WildcardPattern(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~WildcardPattern() = default;